

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O0

char * jsonnet_evaluate_file(JsonnetVm *vm,char *filename,int *error)

{
  char *pcVar1;
  bad_alloc *anon_var_0;
  exception *e;
  EvalKind in_stack_000003f4;
  int *in_stack_000003f8;
  char *in_stack_00000400;
  JsonnetVm *in_stack_00000408;
  
  pcVar1 = jsonnet_evaluate_file_aux
                     (in_stack_00000408,in_stack_00000400,in_stack_000003f8,in_stack_000003f4);
  return pcVar1;
}

Assistant:

char *jsonnet_evaluate_file(JsonnetVm *vm, const char *filename, int *error)
{
    TRY
        return jsonnet_evaluate_file_aux(vm, filename, error, REGULAR);
    CATCH("jsonnet_evaluate_file")
    return nullptr;  // Never happens.
}